

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  canid_t cVar2;
  byte bVar3;
  bool bVar4;
  __u8 _Var5;
  __u8 _Var6;
  byte bVar7;
  byte bVar8;
  char cVar9;
  uchar uVar10;
  byte bVar11;
  int __fd;
  uint uVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined7 uVar24;
  longlong lVar17;
  char *pcVar18;
  size_t sVar19;
  ssize_t sVar20;
  int *piVar21;
  __u8 *p_Var22;
  ulong uVar23;
  char cVar25;
  long lVar26;
  undefined **ppuVar27;
  option *poVar28;
  byte bVar29;
  ulong uVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  byte bVar35;
  timespec tVar36;
  int local_208;
  ulong local_1f0;
  double local_1e8;
  pollfd local_1e0;
  ulong local_1d8;
  byte local_1d0;
  undefined7 uStack_1cf;
  undefined8 local_1c8;
  undefined8 local_1c0;
  ulong local_1b8;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  ulong local_1a0;
  sock_txtime so_txtime_val_read;
  int so_mark_val_read;
  long local_178;
  int loopback;
  __u32 _Stack_16c;
  socklen_t local_168;
  iovec *local_160;
  size_t local_158;
  sock_txtime *local_150;
  size_t sStack_148;
  int local_140;
  sockaddr_can addr;
  uchar fixdata [64];
  timeval now;
  ifreq ifr;
  option long_options [3];
  
  bVar35 = 0;
  addr.can_family = 0;
  addr._2_2_ = 0;
  addr.can_ifindex = 0;
  addr.can_addr.j1939.name = 0;
  addr.can_addr._8_8_ = 0;
  bVar33 = false;
  gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
  srandom((uint)now.tv_usec);
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  ppuVar27 = &PTR_anon_var_dwarf_650_00107d70;
  poVar28 = long_options;
  for (lVar26 = 0xc; lVar26 != 0; lVar26 = lVar26 + -1) {
    poVar28->name = *ppuVar27;
    ppuVar27 = ppuVar27 + (ulong)bVar35 * -2 + 1;
    poVar28 = (option *)((long)poVar28 + (ulong)bVar35 * -0x10 + 8);
  }
  local_1e8 = 200.0;
  local_1b8 = 1;
  local_1d0 = 0;
  uStack_1cf = 0;
  local_1d8 = 0;
  local_1c8 = 0;
  local_208 = 0;
  cVar9 = '\0';
  cVar25 = '\0';
  bVar35 = 0;
  local_1c0 = 0;
  bVar7 = 0;
  bVar8 = 0;
  bVar4 = false;
  local_1a0 = 0;
  bVar11 = 0;
switchD_0010250c_caseD_65:
  bVar29 = bVar11;
  uVar16 = getopt_long(argc,argv,"g:atefbER8mI:L:D:p:n:ixc:vh?",long_options);
  iVar13 = (int)uVar16;
  bVar11 = 1;
  switch(iVar13) {
  case 0x61:
    clock_nanosleep_flags = 1;
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  case 0x62:
    bVar8 = 1;
    break;
  case 99:
    local_1b8 = strtoul(_optarg,(char **)0x0,10);
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  case 100:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x75:
  case 0x77:
    goto switchD_0010250c_caseD_64;
  case 0x65:
    goto switchD_0010250c_caseD_65;
  case 0x66:
    break;
  case 0x67:
    local_1e8 = strtod(_optarg,(char **)0x0);
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  case 0x69:
    ignore_enobufs = 1;
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  case 0x6d:
    local_1c0 = CONCAT71((int7)((ulong)((long)&switchD_0010250c::switchdataD_00105044 +
                                       (long)(int)(&switchD_0010250c::switchdataD_00105044)
                                                  [iVar13 - 0x61]) >> 8),1);
    break;
  case 0x6e:
    local_208 = atoi(_optarg);
    bVar11 = bVar29;
    if (local_208 < 1) {
switchD_0010250c_caseD_64:
      pcVar18 = __xpg_basename(*argv);
      print_usage(pcVar18);
LAB_00102801:
      iVar13 = 1;
LAB_00102805:
      return iVar13;
    }
    goto switchD_0010250c_caseD_65;
  case 0x70:
    local_1a0 = strtoul(_optarg,(char **)0x0,10);
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  case 0x74:
    clock_nanosleep_flags = 1;
    use_so_txtime = 1;
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  case 0x76:
    local_1d0 = local_1d0 + 1;
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  case 0x78:
    bVar33 = true;
    bVar11 = bVar29;
    goto switchD_0010250c_caseD_65;
  default:
    switch(iVar13) {
    case 0x44:
      cVar25 = '\0';
      bVar11 = bVar29;
      if (*_optarg != 'r') {
        if (*_optarg == 'i') {
          cVar25 = '\x01';
        }
        else {
          iVar13 = hexstring2data(_optarg,fixdata,0x40);
          cVar25 = '\x02';
          if (iVar13 != 0) {
            puts("wrong fix data definition");
            goto LAB_00102801;
          }
        }
      }
      break;
    case 0x45:
      bVar7 = 1;
      goto switchD_0010250c_caseD_66;
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
      goto switchD_0010250c_caseD_64;
    case 0x49:
      cVar1 = *_optarg;
      if (cVar1 == 'e') {
        bVar35 = 3;
        bVar11 = bVar29;
      }
      else {
        bVar35 = 0;
        bVar11 = bVar29;
        if (cVar1 != 'r') {
          if (cVar1 == 'o') {
            bVar35 = 4;
          }
          else if (cVar1 == 'i') {
            bVar35 = 1;
          }
          else {
            uVar30 = strtoul(_optarg,(char **)0x0,0x10);
            main::frame.can_id = (canid_t)uVar30;
            bVar35 = 2;
          }
        }
      }
      break;
    case 0x4c:
      cVar9 = '\0';
      bVar11 = bVar29;
      if (*_optarg != 'r') {
        if (*_optarg == 'i') {
          cVar9 = '\x01';
        }
        else {
          iVar13 = atoi(_optarg);
          main::frame.len = (__u8)iVar13;
          cVar9 = '\x02';
        }
      }
      break;
    default:
      uVar24 = (undefined7)((ulong)uVar16 >> 8);
      if (iVar13 == 0x38) goto LAB_00102739;
      if (iVar13 == 0x52) {
        local_1d8 = CONCAT71(uVar24,1);
        bVar11 = bVar29;
      }
      else if (iVar13 == 0x100) {
        uVar30 = strtoul(_optarg,(char **)0x0,0);
        so_mark_val = (int)uVar30;
        bVar11 = bVar29;
      }
      else {
        if (iVar13 != 0x101) {
          if ((iVar13 == -1) && (lVar26 = (long)_optind, _optind != argc)) {
            ts_gap = double_to_timespec(local_1e8 / 1000.0);
            iVar13 = 1;
            if ((bVar35 == 2 && bVar29 == 0) && 0x7ff < main::frame.can_id) {
              puts("The given CAN-ID is greater than 0x7FF and the \'-e\' option is not set.");
              goto LAB_00102805;
            }
            pcVar18 = argv[lVar26];
            sVar19 = strlen(pcVar18);
            if (0xf < sVar19) {
              printf("Name of CAN device \'%s\' is too long!\n\n",pcVar18);
              goto LAB_00102805;
            }
            __fd = socket(0x1d,3,1);
            if (__fd < 0) {
              pcVar18 = "socket";
            }
            else {
              addr.can_family = 0x1d;
              uVar12 = if_nametoindex(argv[_optind]);
              addr.can_ifindex = uVar12;
              if (uVar12 != 0) {
                setsockopt(__fd,0x65,1,(void *)0x0,0);
                if (bVar33) {
                  _loopback = (sock_txtime)((ulong)_loopback & 0xffffffff00000000);
                  setsockopt(__fd,0x65,3,&loopback,4);
                }
                if (bVar4) {
                  loopback = 1;
                  iVar13 = ioctl(__fd,0x8921,&ifr);
                  if (-1 < iVar13) {
                    if (ifr.ifr_ifru.ifru_ivalue == 0x48) {
                      iVar13 = setsockopt(__fd,0x65,5,&loopback,4);
                      if (iVar13 == 0) {
                        uVar10 = can_fd_len2dlc(main::frame.len);
                        main::frame.len = can_fd_dlc2len(uVar10);
                        goto LAB_001029e0;
                      }
                      pcVar18 = "error when enabling CAN FD support";
                    }
                    else {
                      pcVar18 = "CAN interface is not CAN FD capable - sorry.";
                    }
                    puts(pcVar18);
                    iVar13 = 1;
                    goto LAB_00102805;
                  }
                  pcVar18 = "SIOCGIFMTU";
                }
                else {
                  _Var5 = main::frame.__res1;
                  if ((((char)local_1c8 != '\0') &&
                      (_Var6 = '\x0f', _Var5 = main::frame.len, 0xf < main::frame.len)) ||
                     (_Var6 = _Var5, 8 < main::frame.len)) {
                    main::frame.__res1 = _Var6;
                    main::frame.len = '\b';
                  }
LAB_001029e0:
                  iVar13 = bind(__fd,(sockaddr *)&addr,0x18);
                  if (iVar13 < 0) {
                    pcVar18 = "bind";
                  }
                  else {
                    if (use_so_txtime == 1) {
                      loopback = 0xb;
                      _Stack_16c = 2;
                      iVar14 = setsockopt(__fd,1,0x3d,&loopback,8);
                      iVar13 = 1;
                      if (iVar14 == 0) {
                        local_1e0.fd = 8;
                        iVar14 = getsockopt(__fd,1,0x3d,&so_txtime_val_read,(socklen_t *)&local_1e0)
                        ;
                        if (iVar14 == 0) {
                          pcVar18 = "getsockopt() SO_TXTIME: mismatch";
                          if ((local_1e0.fd == 8) && (_loopback == so_txtime_val_read)) {
                            iVar14 = setsockopt(__fd,1,0x24,&so_mark_val,4);
                            if (iVar14 != 0) {
                              piVar21 = __errno_location();
                              iVar14 = *piVar21;
                              pcVar18 = "setsockopt() SO_MARK";
                              goto LAB_001032ea;
                            }
                            local_1e0.fd = 4;
                            iVar14 = getsockopt(__fd,1,0x24,&so_mark_val_read,
                                                (socklen_t *)&local_1e0);
                            if (iVar14 != 0) {
                              pcVar18 = "getsockopt() SO_MARK";
                              goto LAB_00103320;
                            }
                            pcVar18 = "getsockopt() SO_MARK: mismatch";
                            if ((local_1e0.fd == 4) &&
                               (bVar11 = use_so_txtime, so_mark_val == so_mark_val_read))
                            goto LAB_00102b0e;
                          }
                          goto LAB_0010329d;
                        }
                        pcVar18 = "getsockopt() SO_TXTIME";
LAB_00103320:
                        perror(pcVar18);
                        piVar21 = __errno_location();
                        iVar14 = *piVar21;
                      }
                      else {
                        piVar21 = __errno_location();
                        iVar14 = *piVar21;
                        pcVar18 = "setsockopt() SO_TXTIME";
LAB_001032ea:
                        perror(pcVar18);
                        if (iVar14 == 1) {
                          fwrite("Run with CAP_NET_ADMIN or as root.\n",0x23,1,_stderr);
                          goto LAB_00102805;
                        }
                      }
                      bVar11 = use_so_txtime;
                      if (iVar14 != 0) goto LAB_00102805;
                    }
                    else {
                      bVar11 = 0;
                    }
LAB_00102b0e:
                    if ((bVar11 & 1) == 0) {
                      if (ts.tv_nsec != 0 || ts.tv_sec != 0) {
                        uVar12 = clock_nanosleep(0xb,1,(timespec *)&ts,(timespec *)0x0);
                        if ((uVar12 & 0xfffffffb) != 0) {
                          pcVar18 = "clock_nanosleep";
                          goto LAB_0010329d;
                        }
                        tVar36 = ts_gap;
                        if (clock_nanosleep_flags != 0) goto LAB_00102be9;
                      }
                      else {
                        tVar36 = ts_gap;
                        if (clock_nanosleep_flags == 1) {
                          iVar13 = clock_gettime(0xb,(timespec *)&ts);
                          if (iVar13 == 0) goto LAB_00102be9;
                          goto LAB_00102bcd;
                        }
                      }
                      ts = tVar36;
                      ts_gap = ts;
LAB_00102be9:
                      local_1ac = (uint)(2 < local_1d0);
                      local_1a4 = (uint)bVar35;
                      local_1f0 = 0;
                      uVar30 = 0;
                      iVar13 = 0;
                      do {
                        bVar33 = (char)local_1c0 == '\0';
                        local_1a8 = (uint)(bVar8 == 0 ^ 3);
                        if (bVar7 == 0) {
                          local_1a8 = 1;
                        }
                        bVar34 = (char)local_1d8 == '\0';
                        do {
                          if (running == 0) {
                            if (enobufs_count != 0) {
                              printf("\nCounted %llu ENOBUFS return values on write().\n\n");
                            }
                            close(__fd);
                            iVar13 = 0;
                            goto LAB_00102805;
                          }
                          main::frame.flags = '\0';
                          local_1d8 = CONCAT44(local_1d8._4_4_,iVar13);
                          if (local_208 == 0) {
LAB_00102c97:
                            local_208 = 0;
                          }
                          else {
                            local_208 = local_208 + -1;
                            if (local_208 == 0) {
                              running = 0;
                              goto LAB_00102c97;
                            }
                          }
                          local_1e8 = (double)0x10;
                          if (bVar4) {
                            local_1e8 = (double)0x48;
                          }
                          uVar12 = 8;
                          if ((bVar4) && (uVar12 = 0x40, bVar8 != 0 || bVar7 != 0)) {
                            main::frame.flags = (__u8)local_1a8;
                            local_1e8 = 3.55727265005698e-322;
                            uVar12 = 0x40;
                          }
                          if (bVar35 == 4) {
                            lVar26 = random();
                            main::frame.can_id = (uint)lVar26 | 1;
                          }
                          else if (local_1a4 == 3) {
                            lVar26 = random();
                            main::frame.can_id = (uint)lVar26 & 0xfffffffe;
                          }
                          else if (local_1a4 == 0) {
                            lVar26 = random();
                            main::frame.can_id = (canid_t)lVar26;
                          }
                          cVar2 = main::frame.can_id & 0x1fffffff | 0x80000000;
                          if (bVar29 == 0) {
                            cVar2 = main::frame.can_id & 0x7ff;
                          }
                          main::frame.can_id = cVar2 + 0x40000000;
                          if (bVar4 || bVar34) {
                            main::frame.can_id = cVar2;
                          }
                          if (cVar9 == '\0') {
                            lVar26 = random();
                            bVar11 = (byte)lVar26 & 0xf;
                            if (bVar4) {
                              main::frame.len = can_fd_dlc2len(bVar11);
                              goto LAB_00102da4;
                            }
                            if (bVar11 < 9) {
                              main::frame.__res1 = '\0';
                              main::frame.len = bVar11;
                              goto LAB_00102da4;
                            }
                            if ((char)local_1c8 != '\0') {
                              main::frame.__res1 = bVar11;
                            }
                            main::frame.len = '\b';
LAB_00102dbc:
                            if (cVar25 == '\x02') {
                              main::frame.data[0x30] = fixdata[0x30];
                              main::frame.data[0x31] = fixdata[0x31];
                              main::frame.data[0x32] = fixdata[0x32];
                              main::frame.data[0x33] = fixdata[0x33];
                              main::frame.data[0x34] = fixdata[0x34];
                              main::frame.data[0x35] = fixdata[0x35];
                              main::frame.data[0x36] = fixdata[0x36];
                              main::frame.data[0x37] = fixdata[0x37];
                              main::frame.data[0x38] = fixdata[0x38];
                              main::frame.data[0x39] = fixdata[0x39];
                              main::frame.data[0x3a] = fixdata[0x3a];
                              main::frame.data[0x3b] = fixdata[0x3b];
                              main::frame.data[0x3c] = fixdata[0x3c];
                              main::frame.data[0x3d] = fixdata[0x3d];
                              main::frame.data[0x3e] = fixdata[0x3e];
                              main::frame.data[0x3f] = fixdata[0x3f];
                              main::frame.data[0x20] = fixdata[0x20];
                              main::frame.data[0x21] = fixdata[0x21];
                              main::frame.data[0x22] = fixdata[0x22];
                              main::frame.data[0x23] = fixdata[0x23];
                              main::frame.data[0x24] = fixdata[0x24];
                              main::frame.data[0x25] = fixdata[0x25];
                              main::frame.data[0x26] = fixdata[0x26];
                              main::frame.data[0x27] = fixdata[0x27];
                              main::frame.data[0x28] = fixdata[0x28];
                              main::frame.data[0x29] = fixdata[0x29];
                              main::frame.data[0x2a] = fixdata[0x2a];
                              main::frame.data[0x2b] = fixdata[0x2b];
                              main::frame.data[0x2c] = fixdata[0x2c];
                              main::frame.data[0x2d] = fixdata[0x2d];
                              main::frame.data[0x2e] = fixdata[0x2e];
                              main::frame.data[0x2f] = fixdata[0x2f];
                              main::frame.data[0x10] = fixdata[0x10];
                              main::frame.data[0x11] = fixdata[0x11];
                              main::frame.data[0x12] = fixdata[0x12];
                              main::frame.data[0x13] = fixdata[0x13];
                              main::frame.data[0x14] = fixdata[0x14];
                              main::frame.data[0x15] = fixdata[0x15];
                              main::frame.data[0x16] = fixdata[0x16];
                              main::frame.data[0x17] = fixdata[0x17];
                              main::frame.data[0x18] = fixdata[0x18];
                              main::frame.data[0x19] = fixdata[0x19];
                              main::frame.data[0x1a] = fixdata[0x1a];
                              main::frame.data[0x1b] = fixdata[0x1b];
                              main::frame.data[0x1c] = fixdata[0x1c];
                              main::frame.data[0x1d] = fixdata[0x1d];
                              main::frame.data[0x1e] = fixdata[0x1e];
                              main::frame.data[0x1f] = fixdata[0x1f];
                              main::frame.data[0] = fixdata[0];
                              main::frame.data[1] = fixdata[1];
                              main::frame.data[2] = fixdata[2];
                              main::frame.data[3] = fixdata[3];
                              main::frame.data[4] = fixdata[4];
                              main::frame.data[5] = fixdata[5];
                              main::frame.data[6] = fixdata[6];
                              main::frame.data[7] = fixdata[7];
                              main::frame.data[8] = fixdata[8];
                              main::frame.data[9] = fixdata[9];
                              main::frame.data[10] = fixdata[10];
                              main::frame.data[0xb] = fixdata[0xb];
                              main::frame.data[0xc] = fixdata[0xc];
                              main::frame.data[0xd] = fixdata[0xd];
                              main::frame.data[0xe] = fixdata[0xe];
                              main::frame.data[0xf] = fixdata[0xf];
                            }
                            else if (cVar25 == '\0') {
                              lVar26 = random();
                              uVar15 = (undefined4)lVar26;
                              main::frame.data[0] = (char)uVar15;
                              main::frame.data[1] = (char)((uint)uVar15 >> 8);
                              main::frame.data[2] = (char)((uint)uVar15 >> 0x10);
                              main::frame.data[3] = (char)((uint)uVar15 >> 0x18);
                              lVar26 = random();
                              uVar15 = (undefined4)lVar26;
                              main::frame.data[4] = (__u8)uVar15;
                              main::frame.data[5] = (__u8)((uint)uVar15 >> 8);
                              main::frame.data[6] = (__u8)((uint)uVar15 >> 0x10);
                              main::frame.data[7] = (__u8)((uint)uVar15 >> 0x18);
                              uVar16 = main::frame.data._0_8_;
                              main::frame.data._0_8_ = uVar16;
                              if (8 < main::frame.len && bVar4) {
                                main::frame.data[8] = main::frame.data[0];
                                main::frame.data[9] = main::frame.data[1];
                                main::frame.data[10] = main::frame.data[2];
                                main::frame.data[0xb] = main::frame.data[3];
                                main::frame.data[0xc] = main::frame.data[4];
                                main::frame.data[0xd] = main::frame.data[5];
                                main::frame.data[0xe] = main::frame.data[6];
                                main::frame.data[0xf] = main::frame.data[7];
                                main::frame.data[0x10] = main::frame.data[0];
                                main::frame.data[0x11] = main::frame.data[1];
                                main::frame.data[0x12] = main::frame.data[2];
                                main::frame.data[0x13] = main::frame.data[3];
                                main::frame.data[0x14] = main::frame.data[4];
                                main::frame.data[0x15] = main::frame.data[5];
                                main::frame.data[0x16] = main::frame.data[6];
                                main::frame.data[0x17] = main::frame.data[7];
                                main::frame.data[0x18] = main::frame.data[0];
                                main::frame.data[0x19] = main::frame.data[1];
                                main::frame.data[0x1a] = main::frame.data[2];
                                main::frame.data[0x1b] = main::frame.data[3];
                                main::frame.data[0x1c] = main::frame.data[4];
                                main::frame.data[0x1d] = main::frame.data[5];
                                main::frame.data[0x1e] = main::frame.data[6];
                                main::frame.data[0x1f] = main::frame.data[7];
                                main::frame.data[0x20] = main::frame.data[0];
                                main::frame.data[0x21] = main::frame.data[1];
                                main::frame.data[0x22] = main::frame.data[2];
                                main::frame.data[0x23] = main::frame.data[3];
                                main::frame.data[0x24] = main::frame.data[4];
                                main::frame.data[0x25] = main::frame.data[5];
                                main::frame.data[0x26] = main::frame.data[6];
                                main::frame.data[0x27] = main::frame.data[7];
                                main::frame.data[0x28] = main::frame.data[0];
                                main::frame.data[0x29] = main::frame.data[1];
                                main::frame.data[0x2a] = main::frame.data[2];
                                main::frame.data[0x2b] = main::frame.data[3];
                                main::frame.data[0x2c] = main::frame.data[4];
                                main::frame.data[0x2d] = main::frame.data[5];
                                main::frame.data[0x2e] = main::frame.data[6];
                                main::frame.data[0x2f] = main::frame.data[7];
                                main::frame.data[0x30] = main::frame.data[0];
                                main::frame.data[0x31] = main::frame.data[1];
                                main::frame.data[0x32] = main::frame.data[2];
                                main::frame.data[0x33] = main::frame.data[3];
                                main::frame.data[0x34] = main::frame.data[4];
                                main::frame.data[0x35] = main::frame.data[5];
                                main::frame.data[0x36] = main::frame.data[6];
                                main::frame.data[0x37] = main::frame.data[7];
                                main::frame.data[0x38] = main::frame.data[0];
                                main::frame.data[0x39] = main::frame.data[1];
                                main::frame.data[0x3a] = main::frame.data[2];
                                main::frame.data[0x3b] = main::frame.data[3];
                                main::frame.data[0x3c] = main::frame.data[4];
                                main::frame.data[0x3d] = main::frame.data[5];
                                main::frame.data[0x3e] = main::frame.data[6];
                                main::frame.data[0x3f] = main::frame.data[7];
                              }
                            }
                          }
                          else {
LAB_00102da4:
                            if ((cVar25 != '\x01') || (main::frame.len != '\0')) goto LAB_00102dbc;
                            main::frame.len = '\x01';
                          }
                          iVar13 = uVar12 - main::frame.len;
                          if (main::frame.len <= uVar12 && iVar13 != 0) {
                            memset(main::frame.data + main::frame.len,0,(long)iVar13);
                          }
                          if (use_so_txtime == 0) {
                            if ((ts.tv_sec != 0 || ts.tv_nsec != 0) && (local_1b8 <= local_1f0)) {
                              uVar31 = (uint)clock_nanosleep_flags;
                              if (uVar31 == 1) {
                                ts = timespec_add(ts,ts_gap);
                              }
                              uVar31 = clock_nanosleep(0xb,uVar31,(timespec *)&ts,(timespec *)0x0);
                              if ((uVar31 & 0xfffffffb) != 0) {
                                pcVar18 = "clock_nanosleep";
LAB_00103283:
                                perror(pcVar18);
                                goto LAB_00102801;
                              }
                            }
                          }
                          if (local_1d0 != 0) {
                            printf("  %s  ",argv[_optind]);
                            if (local_1d0 == 1) {
                              fprint_canframe(_stdout,&main::frame,"\n",1,uVar12);
                            }
                            else {
                              fprint_long_canframe(_stdout,&main::frame,"\n",local_1ac,uVar12);
                            }
                          }
                          so_txtime_val_read.clockid = 0;
                          so_txtime_val_read.flags = 0;
                          _so_mark_val_read = &main::frame;
                          loopback = 0;
                          _Stack_16c = 0;
                          local_168 = 0;
                          local_160 = (iovec *)&so_mark_val_read;
                          local_158 = 1;
                          local_140 = 0;
                          local_178 = (long)local_1e8;
                          local_150 = (sock_txtime *)0x0;
                          sStack_148 = 0;
                          if (use_so_txtime == 1) {
                            local_150 = &so_txtime_val_read;
                            sStack_148 = 0x18;
                            ts = timespec_add(ts,ts_gap);
                            so_txtime_val_read.clockid = 0x18;
                            so_txtime_val_read.flags = 0;
                          }
                          do {
                            while( true ) {
                              sVar20 = sendmsg(__fd,(msghdr *)&loopback,0);
                              if (-1 < sVar20) {
                                if ((long)local_1e8 <= sVar20) goto LAB_001030fa;
                                fwrite("write: incomplete CAN frame\n",0x1c,1,_stderr);
                                goto LAB_00102801;
                              }
                              piVar21 = __errno_location();
                              iVar13 = *piVar21;
                              if (iVar13 != 0x69) {
                                pcVar18 = "write";
                                goto LAB_001031dd;
                              }
                              iVar13 = (int)local_1a0;
                              if ((iVar13 == 0) && ((ignore_enobufs & 1) == 0)) {
                                pcVar18 = "write";
                                goto LAB_00103283;
                              }
                              if (iVar13 == 0) {
                                enobufs_count = enobufs_count + 1;
                                goto LAB_001030fa;
                              }
                              local_1e0.events = 4;
                              local_1e0.revents = 0;
                              local_1e0.fd = __fd;
                              iVar13 = poll(&local_1e0,1,iVar13);
                              if (iVar13 != -1) break;
                              iVar13 = *piVar21;
                              if (iVar13 != 4) goto LAB_001031d6;
                            }
                          } while (iVar13 != 0);
                          iVar13 = *piVar21;
LAB_001031d6:
                          pcVar18 = "poll";
LAB_001031dd:
                          perror(pcVar18);
                          if (iVar13 != 0) goto LAB_00102801;
LAB_001030fa:
                          bVar32 = local_1b8 <= local_1f0;
                          local_1f0 = local_1f0 + 1;
                          if (bVar32) {
                            local_1f0 = 1;
                          }
                          if (bVar35 == 1) {
                            main::frame.can_id = main::frame.can_id + 1;
                          }
                          iVar13 = (int)local_1d8;
                          if (cVar9 == '\x01') {
                            lVar26 = (long)((int)local_1d8 + 1) % 0x10;
                            iVar13 = (int)lVar26;
                            uVar10 = (uchar)lVar26;
                            if (bVar4 && bVar33) {
                              main::frame.len = can_fd_dlc2len(uVar10);
                            }
                            else if ((char)local_1c8 == '\0') {
                              main::frame.len = (char)uVar10 % '\t';
                              iVar13 = (int)(char)main::frame.len;
                            }
                            else if (iVar13 < 9) {
                              main::frame.__res1 = '\0';
                              main::frame.len = uVar10;
                            }
                            else {
                              main::frame.len = '\b';
                              main::frame.__res1 = uVar10;
                            }
                          }
                          if (cVar25 == '\x01') {
                            uVar30 = uVar30 + 1;
                            p_Var22 = main::frame.data;
                            for (lVar26 = 0; lVar26 != 0x40; lVar26 = lVar26 + 8) {
                              *p_Var22 = (__u8)(uVar30 >> ((byte)lVar26 & 0x3f));
                              p_Var22 = p_Var22 + 1;
                            }
                          }
                        } while ((char)local_1c0 == '\0');
                        uVar23 = random();
                        bVar11 = (byte)uVar23;
                        bVar29 = bVar11 & 1;
                        bVar4 = false;
                        bVar3 = bVar11 & 4;
                        bVar11 = bVar11 & 8;
                        if ((uVar23 & 2) == 0) {
                          bVar3 = bVar8;
                          bVar11 = bVar7;
                        }
                        bVar7 = bVar11;
                        local_1d8 = (ulong)CONCAT31((int3)(~(uint)uVar23 >> 8),
                                                    (~(uint)uVar23 & 0x18) == 0);
                        bVar8 = bVar3;
                      } while( true );
                    }
                    if (ts.tv_nsec != 0 || ts.tv_sec != 0) goto LAB_00102be9;
                    iVar13 = clock_gettime(0xb,(timespec *)&ts);
                    if (iVar13 == 0) {
                      ts = timespec_add(ts,ts_gap);
                      goto LAB_00102be9;
                    }
LAB_00102bcd:
                    pcVar18 = "clock_gettime";
                  }
                }
                perror(pcVar18);
                iVar13 = 1;
                goto LAB_00102805;
              }
              pcVar18 = "if_nametoindex";
            }
LAB_0010329d:
            perror(pcVar18);
            iVar13 = 1;
            goto LAB_00102805;
          }
          goto switchD_0010250c_caseD_64;
        }
        lVar17 = strtoll(_optarg,(char **)0x0,0);
        tVar36.tv_nsec = lVar17 % 1000000000;
        tVar36.tv_sec = lVar17 / 1000000000;
        ts = timespec_normalise(tVar36);
        bVar11 = bVar29;
      }
    }
    goto switchD_0010250c_caseD_65;
  }
switchD_0010250c_caseD_66:
  bVar4 = true;
  bVar11 = bVar29;
  goto switchD_0010250c_caseD_65;
LAB_00102739:
  local_1c8 = CONCAT71(uVar24,1);
  bVar11 = bVar29;
  goto switchD_0010250c_caseD_65;
}

Assistant:

int main(int argc, char **argv)
{
	double gap = DEFAULT_GAP;
	unsigned long burst_count = DEFAULT_BURST_COUNT;
	unsigned long polltimeout = 0;
	unsigned char extended = 0;
	unsigned char canfd = 0;
	unsigned char brs = 0;
	unsigned char esi = 0;
	unsigned char mix = 0;
	unsigned char id_mode = MODE_RANDOM;
	unsigned char data_mode = MODE_RANDOM;
	unsigned char dlc_mode = MODE_RANDOM;
	unsigned char loopback_disable = 0;
	unsigned char verbose = 0;
	unsigned char rtr_frame = 0;
	unsigned char len8_dlc = 0;
	int count = 0;
	unsigned long burst_sent_count = 0;
	int mtu, maxdlen;
	uint64_t incdata = 0;
	int incdlc = 0;
	unsigned long rnd;
	unsigned char fixdata[CANFD_MAX_DLEN];

	int opt;
	int s; /* socket */

	struct sockaddr_can addr = { 0 };
	static struct canfd_frame frame;
	struct can_frame *ccf = (struct can_frame *)&frame;
	int i;
	struct ifreq ifr;

	struct timeval now;
	int ret;

	/* set seed value for pseudo random numbers */
	gettimeofday(&now, NULL);
	srandom(now.tv_usec);

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	const struct option long_options[] = {
		{ "mark",	required_argument,	0, OPT_MARK, },
		{ "start",	required_argument,	0, OPT_START, },
		{ 0,		0,			0, 0 },
	};

	while ((opt = getopt_long(argc, argv, "g:atefbER8mI:L:D:p:n:ixc:vh?", long_options, NULL)) != -1) {
		switch (opt) {

		case 'g':
			gap = strtod(optarg, NULL);
			break;

		case 'a':
			clock_nanosleep_flags = TIMER_ABSTIME;
			break;

		case 't':
			clock_nanosleep_flags = TIMER_ABSTIME;
			use_so_txtime = true;
			break;

		case OPT_START: {
			int64_t start_time_ns;

			start_time_ns = strtoll(optarg, NULL, 0);
			ts = ns_to_timespec(start_time_ns);

			break;
		}
		case OPT_MARK:
			so_mark_val = strtoul(optarg, NULL, 0);
			break;
		case 'e':
			extended = 1;
			break;

		case 'f':
			canfd = 1;
			break;

		case 'b':
			brs = 1; /* bitrate switch implies CAN FD */
			canfd = 1;
			break;

		case 'E':
			esi = 1; /* error state indicator implies CAN FD */
			canfd = 1;
			break;

		case 'R':
			rtr_frame = 1;
			break;

		case '8':
			len8_dlc = 1;
			break;

		case 'm':
			mix = 1;
			canfd = 1; /* to switch the socket into CAN FD mode */
			break;

		case 'I':
			if (optarg[0] == 'r') {
				id_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				id_mode = MODE_INCREMENT;
			} else if (optarg[0] == 'e') {
				id_mode = MODE_RANDOM_EVEN;
			} else if (optarg[0] == 'o') {
				id_mode = MODE_RANDOM_ODD;
			} else {
				id_mode = MODE_FIX;
				frame.can_id = strtoul(optarg, NULL, 16);
			}
			break;

		case 'L':
			if (optarg[0] == 'r') {
				dlc_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				dlc_mode = MODE_INCREMENT;
			} else {
				dlc_mode = MODE_FIX;
				frame.len = atoi(optarg) & 0xFF; /* is cut to 8 / 64 later */
			}
			break;

		case 'D':
			if (optarg[0] == 'r') {
				data_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				data_mode = MODE_INCREMENT;
			} else {
				data_mode = MODE_FIX;
				if (hexstring2data(optarg, fixdata, CANFD_MAX_DLEN)) {
					printf("wrong fix data definition\n");
					return 1;
				}
			}
			break;

		case 'p':
			polltimeout = strtoul(optarg, NULL, 10);
			break;

		case 'n':
			count = atoi(optarg);
			if (count < 1) {
				print_usage(basename(argv[0]));
				return 1;
			}
			break;

		case 'i':
			ignore_enobufs = true;
			break;

		case 'x':
			loopback_disable = 1;
			break;

		case 'c':
			burst_count = strtoul(optarg, NULL, 10);
			break;

		case 'v':
			verbose++;
			break;

		case '?':
		case 'h':
		default:
			print_usage(basename(argv[0]));
			return 1;
		}
	}

	if (optind == argc) {
		print_usage(basename(argv[0]));
		return 1;
	}

	ts_gap = double_to_timespec(gap / 1000);

	/* recognize obviously missing commandline option */
	if (id_mode == MODE_FIX && frame.can_id > 0x7FF && !extended) {
		printf("The given CAN-ID is greater than 0x7FF and the '-e' option is not set.\n");
		return 1;
	}

	if (strlen(argv[optind]) >= IFNAMSIZ) {
		printf("Name of CAN device '%s' is too long!\n\n", argv[optind]);
		return 1;
	}

	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[optind]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	/*
	 * disable default receive filter on this RAW socket
	 * This is obsolete as we do not read from the socket at all, but for
	 * this reason we can remove the receive list in the Kernel to save a
	 * little (really a very little!) CPU usage.
	 */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (loopback_disable) {
		const int loopback = 0;

		setsockopt(s, SOL_CAN_RAW, CAN_RAW_LOOPBACK,
			   &loopback, sizeof(loopback));
	}

	if (canfd) {
		const int enable_canfd = 1;

		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			return 1;
		}

		if (ifr.ifr_mtu != CANFD_MTU) {
			printf("CAN interface is not CAN FD capable - sorry.\n");
			return 1;
		}

		/* interface is ok - try to switch the socket into CAN FD mode */
		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &enable_canfd, sizeof(enable_canfd))) {
			printf("error when enabling CAN FD support\n");
			return 1;
		}

		/* ensure discrete CAN FD length values 0..8, 12, 16, 20, 24, 32, 64 */
		frame.len = can_fd_dlc2len(can_fd_len2dlc(frame.len));
	} else {
		/* sanitize Classical CAN 2.0 frame length */
		if (len8_dlc) {
			if (frame.len > CAN_MAX_RAW_DLC)
				frame.len = CAN_MAX_RAW_DLC;

			if (frame.len > CAN_MAX_DLEN)
				ccf->len8_dlc = frame.len;
		}

		if (frame.len > CAN_MAX_DLEN)
			frame.len = CAN_MAX_DLEN;
	}

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	if (use_so_txtime) {
		ret = setsockopt_txtime(s);
		if (ret)
			return 1;
	}

	ret = setup_time();
	if (ret)
		return 1;

	while (running) {
		frame.flags = 0;

		if (count && (--count == 0))
			running = 0;

		if (canfd) {
			mtu = CANFD_MTU;
			maxdlen = CANFD_MAX_DLEN;
			if (brs)
				frame.flags |= CANFD_BRS;
			if (esi)
				frame.flags |= CANFD_ESI;
		} else {
			mtu = CAN_MTU;
			maxdlen = CAN_MAX_DLEN;
		}

		if (id_mode == MODE_RANDOM)
			frame.can_id = random();
		else if (id_mode == MODE_RANDOM_EVEN)
			frame.can_id = random() & ~0x1;
		else if (id_mode == MODE_RANDOM_ODD)
			frame.can_id = random() | 0x1;

		if (extended) {
			frame.can_id &= CAN_EFF_MASK;
			frame.can_id |= CAN_EFF_FLAG;
		} else
			frame.can_id &= CAN_SFF_MASK;

		if (rtr_frame && !canfd)
			frame.can_id |= CAN_RTR_FLAG;

		if (dlc_mode == MODE_RANDOM) {
			if (canfd)
				frame.len = can_fd_dlc2len(random() & 0xF);
			else {
				frame.len = random() & 0xF;

				if (frame.len > CAN_MAX_DLEN) {
					/* generate Classic CAN len8 DLCs? */
					if (len8_dlc)
						ccf->len8_dlc = frame.len;

					frame.len = 8; /* for about 50% of the frames */
				} else {
					ccf->len8_dlc = 0;
				}
			}
		}

		if (data_mode == MODE_INCREMENT && !frame.len)
			frame.len = 1; /* min dlc value for incr. data */

		if (data_mode == MODE_RANDOM) {
			rnd = random();
			memcpy(&frame.data[0], &rnd, 4);
			rnd = random();
			memcpy(&frame.data[4], &rnd, 4);

			/* omit extra random number generation for CAN FD */
			if (canfd && frame.len > 8) {
				memcpy(&frame.data[8], &frame.data[0], 8);
				memcpy(&frame.data[16], &frame.data[0], 16);
				memcpy(&frame.data[32], &frame.data[0], 32);
			}
		}

		if (data_mode == MODE_FIX)
			memcpy(frame.data, fixdata, CANFD_MAX_DLEN);

		/* set unused payload data to zero like the CAN driver does it on rx */
		if (frame.len < maxdlen)
			memset(&frame.data[frame.len], 0, maxdlen - frame.len);

		if (!use_so_txtime &&
		    (ts.tv_sec || ts.tv_nsec) &&
		    burst_sent_count >= burst_count) {
			if (clock_nanosleep_flags == TIMER_ABSTIME)
				ts = timespec_add(ts, ts_gap);

			ret = clock_nanosleep(clockid, clock_nanosleep_flags, &ts, NULL);
			if (ret != 0 && ret != EINTR) {
				perror("clock_nanosleep");
				return 1;
			}
		}

		if (verbose) {
			printf("  %s  ", argv[optind]);

			if (verbose > 1)
				fprint_long_canframe(stdout, &frame, "\n", (verbose > 2) ? 1 : 0, maxdlen);
			else
				fprint_canframe(stdout, &frame, "\n", 1, maxdlen);
		}

		ret = do_send_one(s, &frame, mtu, polltimeout);
		if (ret)
			return 1;

		if (burst_sent_count >= burst_count)
			burst_sent_count = 0;
		burst_sent_count++;

		if (id_mode == MODE_INCREMENT)
			frame.can_id++;

		if (dlc_mode == MODE_INCREMENT) {
			incdlc++;
			incdlc %= CAN_MAX_RAW_DLC + 1;

			if (canfd && !mix)
				frame.len = can_fd_dlc2len(incdlc);
			else if (len8_dlc) {
				if (incdlc > CAN_MAX_DLEN) {
					frame.len = CAN_MAX_DLEN;
					ccf->len8_dlc = incdlc;
				} else {
					frame.len = incdlc;
					ccf->len8_dlc = 0;
				}
			} else {
				incdlc %= CAN_MAX_DLEN + 1;
				frame.len = incdlc;
			}
		}

		if (data_mode == MODE_INCREMENT) {
			incdata++;

			for (i = 0; i < 8; i++)
				frame.data[i] = incdata >> i * 8;
		}

		if (mix) {
			i = random();
			extended = i & 1;
			canfd = i & 2;
			if (canfd) {
				brs = i & 4;
				esi = i & 8;
			}
			rtr_frame = ((i & 24) == 24); /* reduce RTR frames to 1/4 */
		}
	}

	if (enobufs_count)
		printf("\nCounted %llu ENOBUFS return values on write().\n\n",
		       enobufs_count);

	close(s);

	return 0;
}